

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O0

void __thiscall
ot::commissioner::BorderAgent::BorderAgent
          (BorderAgent *this,string *aAddr,uint16_t aPort,ByteArray *aDiscriminator,
          string *aThreadVersion,State aState,string *aNetworkName,uint64_t aExtendedPanId,
          string *aVendorName,string *aModelName,Timestamp aActiveTimestamp,uint32_t aPartitionId,
          string *aVendorData,ByteArray *aVendorOui,string *aDomainName,uint8_t aBbrSeqNumber,
          uint16_t aBbrPort,string *aServiceName,UnixTime aUpdateTimestamp,uint32_t aPresentFlags)

{
  string *aThreadVersion_local;
  ByteArray *aDiscriminator_local;
  uint16_t aPort_local;
  string *aAddr_local;
  BorderAgent *this_local;
  UnixTime aUpdateTimestamp_local;
  Timestamp aActiveTimestamp_local;
  State aState_local;
  
  this->_vptr_BorderAgent = (_func_int **)&PTR__BorderAgent_0047e850;
  std::__cxx11::string::string((string *)&this->mAddr,(string *)aAddr);
  this->mPort = aPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->mDiscriminator,aDiscriminator);
  std::__cxx11::string::string((string *)&this->mThreadVersion,(string *)aThreadVersion);
  this->mState = aState;
  std::__cxx11::string::string((string *)&this->mNetworkName,(string *)aNetworkName);
  this->mExtendedPanId = aExtendedPanId;
  std::__cxx11::string::string((string *)&this->mVendorName,(string *)aVendorName);
  std::__cxx11::string::string((string *)&this->mModelName,(string *)aModelName);
  this->mActiveTimestamp = aActiveTimestamp;
  this->mPartitionId = aPartitionId;
  std::__cxx11::string::string((string *)&this->mVendorData,(string *)aVendorData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mVendorOui,aVendorOui);
  std::__cxx11::string::string((string *)&this->mDomainName,(string *)aDomainName);
  this->mBbrSeqNumber = aBbrSeqNumber;
  this->mBbrPort = aBbrPort;
  std::__cxx11::string::string((string *)&this->mServiceName,(string *)aServiceName);
  (this->mUpdateTimestamp).mTime = aUpdateTimestamp.mTime;
  this->mPresentFlags = aPresentFlags;
  return;
}

Assistant:

BorderAgent::BorderAgent(std::string const &aAddr,
                         uint16_t           aPort,
                         ByteArray const   &aDiscriminator,
                         std::string const &aThreadVersion,
                         BorderAgent::State aState,
                         std::string const &aNetworkName,
                         uint64_t           aExtendedPanId,
                         std::string const &aVendorName,
                         std::string const &aModelName,
                         Timestamp          aActiveTimestamp,
                         uint32_t           aPartitionId,
                         std::string const &aVendorData,
                         ByteArray const   &aVendorOui,
                         std::string const &aDomainName,
                         uint8_t            aBbrSeqNumber,
                         uint16_t           aBbrPort,
                         std::string const &aServiceName,
                         UnixTime           aUpdateTimestamp,
                         uint32_t           aPresentFlags)
    : mAddr(aAddr)
    , mPort(aPort)
    , mDiscriminator(aDiscriminator)
    , mThreadVersion(aThreadVersion)
    , mState{aState}
    , mNetworkName(aNetworkName)
    , mExtendedPanId(aExtendedPanId)
    , mVendorName(aVendorName)
    , mModelName(aModelName)
    , mActiveTimestamp{aActiveTimestamp}
    , mPartitionId(aPartitionId)
    , mVendorData(aVendorData)
    , mVendorOui(aVendorOui)
    , mDomainName(aDomainName)
    , mBbrSeqNumber(aBbrSeqNumber)
    , mBbrPort(aBbrPort)
    , mServiceName(aServiceName)
    , mUpdateTimestamp(aUpdateTimestamp)
    , mPresentFlags(aPresentFlags)
{
}